

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_thread.c
# Opt level: O0

int nni_plat_thr_init(nni_plat_thr *thr,_func_void_void_ptr *fn,void *arg)

{
  int iVar1;
  int rv;
  void *arg_local;
  _func_void_void_ptr *fn_local;
  nni_plat_thr *thr_local;
  
  thr->func = fn;
  thr->arg = arg;
  iVar1 = pthread_create(&thr->tid,(pthread_attr_t *)&nni_thrattr,nni_plat_thr_main,thr);
  if (iVar1 == 0) {
    thr_local._4_4_ = 0;
  }
  else {
    thr_local._4_4_ = 2;
  }
  return thr_local._4_4_;
}

Assistant:

int
nni_plat_thr_init(nni_plat_thr *thr, void (*fn)(void *), void *arg)
{
	int rv;

	thr->func = fn;
	thr->arg  = arg;

	// POSIX wants functions to return a void *, but we don't care.
	rv = pthread_create(&thr->tid, &nni_thrattr, nni_plat_thr_main, thr);
	if (rv != 0) {
		// nni_printf("pthread_create: %s",
		// strerror(rv));
		return (NNG_ENOMEM);
	}
	return (0);
}